

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O1

ConstantValue * __thiscall
slang::ast::Bitstream::evaluateCast
          (ConstantValue *__return_storage_ptr__,Bitstream *this,Type *type,ConstantValue *value,
          SourceRange sourceRange,EvalContext *context,bool isImplicit)

{
  SourceRange range;
  SourceRange range_00;
  bool bVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  Diagnostic *pDVar4;
  pointer ppCVar5;
  int line;
  char *expr;
  ulong uVar6;
  pair<unsigned_long,_unsigned_long> pVar7;
  pair<unsigned_long,_unsigned_long> pVar8;
  bitwidth_t bitOffset;
  const_iterator iter;
  SmallVector<slang::ConstantValue_*,_5UL> packed;
  pointer local_a0;
  bitwidth_t local_94;
  SourceLocation local_90;
  SourceLocation local_88;
  SourceLocation local_80;
  char *local_78;
  SmallVectorBase<slang::ConstantValue_*> local_70 [2];
  
  local_90 = sourceRange.endLoc;
  local_80 = sourceRange.startLoc;
  local_88 = (SourceLocation)value;
  ppCVar2 = (pointer)ConstantValue::bitstreamWidth((ConstantValue *)type);
  local_a0 = (pointer)0x0;
  if ((char)context == '\0') {
    bVar1 = Type::isFixedSize((Type *)this);
    if (bVar1) {
      ppCVar5 = (pointer)Type::bitstreamWidth((Type *)this);
      local_a0 = (pointer)0x0;
      if (ppCVar5 != ppCVar2) {
        local_a0 = (pointer)((long)ppCVar2 + 1);
      }
    }
    else {
      pVar7 = dynamicBitstreamSize((Type *)this,DestEmpty);
      if (ppCVar2 < (pointer)pVar7.second) {
LAB_002131a6:
        local_a0 = (pointer)((long)ppCVar2 + 1);
      }
      else {
        uVar6 = (long)ppCVar2 - (long)pVar7.second;
        if (uVar6 == 0) {
          local_a0 = (pointer)0x0;
        }
        else {
          pVar8 = dynamicBitstreamSize((Type *)this,DestFill);
          local_a0 = (pointer)((long)ppCVar2 - (long)pVar8.second);
          if (((ppCVar2 < (pointer)pVar8.second) || ((ulong)local_a0 % pVar8.first != 0)) &&
             ((pVar7.first == 0 || (local_a0 = (pointer)0x0, uVar6 % pVar7.first != 0))))
          goto LAB_002131a6;
        }
      }
    }
    ppCVar5 = local_a0;
    if (ppCVar2 < local_a0) {
      range_00.endLoc = local_80;
      range_00.startLoc = local_88;
      pDVar4 = EvalContext::addDiag((EvalContext *)local_90,(DiagCode)0x3000c,range_00);
      local_70[0].data_ = (pointer)ConstantValue::bitstreamWidth((ConstantValue *)type);
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
      ::emplace_back<unsigned_long>(&pDVar4->args,(unsigned_long *)local_70);
      ast::operator<<(pDVar4,(Type *)this);
LAB_0021320a:
      *(__index_type *)
       ((long)&(__return_storage_ptr__->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 0x20) = '\0';
      return __return_storage_ptr__;
    }
  }
  else {
    ppCVar3 = (pointer)Type::bitstreamWidth((Type *)this);
    ppCVar5 = local_a0;
    if ((ppCVar3 <= ppCVar2 && (pointer)((long)ppCVar2 - (long)ppCVar3) != (pointer)0x0) &&
       (bVar1 = Type::isFixedSize((Type *)this), ppCVar5 = (pointer)((long)ppCVar2 - (long)ppCVar3),
       bVar1)) {
      range.endLoc = local_80;
      range.startLoc = local_88;
      pDVar4 = EvalContext::addDiag((EvalContext *)local_90,(DiagCode)0x2b0007,range);
      local_70[0].data_ = ppCVar3;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
      ::emplace_back<unsigned_long>(&pDVar4->args,(unsigned_long *)local_70);
      local_70[0].data_ = ppCVar2;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
      ::emplace_back<unsigned_long>(&pDVar4->args,(unsigned_long *)local_70);
      goto LAB_0021320a;
    }
  }
  local_a0 = ppCVar5;
  local_70[0].len = 0;
  local_70[0].cap = 5;
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  packBitstream((ConstantValue *)type,local_70);
  local_94 = 0;
  local_78 = (char *)local_70[0].data_;
  unpackBitstream(__return_storage_ptr__,(Type *)this,(PackIterator *)&local_78,
                  (PackIterator)((long)local_70[0].data_ + local_70[0].len * 8),&local_94,
                  (size_t *)&local_a0);
  if (local_a0 == (pointer)0x0) {
    if ((char)context == '\0') {
      line = 0x1b9;
      expr = "isImplicit || (iter == std::cend(packed) && !bitOffset)";
      if ((local_78 != (char *)((long)local_70[0].data_ + local_70[0].len * 8)) || (local_94 != 0))
      goto LAB_0021332a;
    }
    if (local_70[0].data_ != (pointer)local_70[0].firstElement) {
      free(local_70[0].data_);
    }
    return __return_storage_ptr__;
  }
  line = 0x1b8;
  expr = "!dynamicSize";
LAB_0021332a:
  assert::assertFailed
            (expr,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Bitstream.cpp"
             ,line,
             "static ConstantValue slang::ast::Bitstream::evaluateCast(const Type &, ConstantValue &&, SourceRange, EvalContext &, bool)"
            );
}

Assistant:

ConstantValue Bitstream::evaluateCast(const Type& type, ConstantValue&& value,
                                      SourceRange sourceRange, EvalContext& context,
                                      bool isImplicit) {
    auto srcSize = value.bitstreamWidth();
    size_t dynamicSize = 0;
    if (!isImplicit) { // Explicit bit-stream casting
        dynamicSize = bitstreamCastRemainingSize(type, srcSize);
        if (dynamicSize > srcSize) {
            context.addDiag(diag::ConstEvalBitstreamCastSize, sourceRange)
                << value.bitstreamWidth() << type;
            return nullptr;
        }
    }
    else { // implicit streaming concatenation conversion
        auto targetWidth = type.bitstreamWidth();
        if (targetWidth < srcSize) {
            if (type.isFixedSize()) {
                context.addDiag(diag::BadStreamSize, sourceRange) << targetWidth << srcSize;
                return nullptr;
            }
            dynamicSize = srcSize - targetWidth;
        }
    }

    SmallVector<ConstantValue*> packed;
    packBitstream(value, packed);

    bitwidth_t bitOffset = 0;
    auto iter = std::cbegin(packed);
    auto cv = unpackBitstream(type, iter, std::cend(packed), bitOffset, dynamicSize);
    ASSERT(!dynamicSize);
    ASSERT(isImplicit || (iter == std::cend(packed) && !bitOffset));
    return cv;
}